

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O1

void __thiscall ncnn::Proposal::Proposal(Proposal *this)

{
  Mat *pMVar1;
  int *piVar2;
  Allocator *pAVar3;
  void *__ptr;
  undefined8 *puVar4;
  int iVar5;
  void *in_RAX;
  void *ptr;
  void *local_28;
  
  local_28 = in_RAX;
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Proposal_001a62e0;
  *(undefined8 *)((long)&(this->ratios).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->ratios).elemsize + 4) = 0;
  (this->ratios).data = (void *)0x0;
  (this->ratios).refcount = (int *)0x0;
  pMVar1 = &this->scales;
  (this->anchors).allocator = (Allocator *)0x0;
  (this->anchors).dims = 0;
  (this->anchors).w = 0;
  (this->anchors).h = 0;
  (this->anchors).c = 0;
  (this->anchors).cstep = 0;
  (this->super_Layer).one_blob_only = false;
  (this->super_Layer).support_inplace = false;
  (this->ratios).allocator = (Allocator *)0x0;
  (this->ratios).dims = 0;
  (this->ratios).w = 0;
  (this->ratios).h = 0;
  (this->ratios).c = 0;
  (this->ratios).cstep = 0;
  (this->scales).data = (void *)0x0;
  (this->scales).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->scales).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->scales).elemsize + 4) = 0;
  (this->scales).allocator = (Allocator *)0x0;
  (this->scales).dims = 0;
  (this->scales).w = 0;
  (this->scales).h = 0;
  (this->scales).c = 0;
  (this->scales).cstep = 0;
  (this->anchors).data = (void *)0x0;
  (this->anchors).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->anchors).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->anchors).elemsize + 4) = 0;
  if (((((this->ratios).dims != 1) || ((this->ratios).w != 3)) || ((this->ratios).elemsize != 4)) ||
     (((this->ratios).elempack != 1 || ((this->ratios).allocator != (Allocator *)0x0)))) {
    piVar2 = (this->ratios).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pAVar3 = (this->ratios).allocator;
        __ptr = (this->ratios).data;
        if (pAVar3 == (Allocator *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*(long *)pAVar3 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&(this->ratios).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->ratios).elemsize + 4) = 0;
    (this->ratios).data = (void *)0x0;
    (this->ratios).refcount = (int *)0x0;
    (this->ratios).cstep = 0;
    (this->ratios).dims = 0;
    (this->ratios).w = 0;
    (this->ratios).h = 0;
    (this->ratios).c = 0;
    (this->ratios).elemsize = 4;
    (this->ratios).elempack = 1;
    (this->ratios).allocator = (Allocator *)0x0;
    (this->ratios).dims = 1;
    (this->ratios).w = 3;
    (this->ratios).h = 1;
    (this->ratios).c = 1;
    (this->ratios).cstep = 3;
    local_28 = (void *)0x0;
    iVar5 = posix_memalign(&local_28,0x10,0x10);
    if (iVar5 != 0) {
      local_28 = (void *)0x0;
    }
    (this->ratios).data = local_28;
    (this->ratios).refcount = (int *)((long)local_28 + 0xc);
    *(undefined4 *)((long)local_28 + 0xc) = 1;
  }
  puVar4 = (undefined8 *)(this->ratios).data;
  *puVar4 = 0x3f8000003f000000;
  *(undefined4 *)(puVar4 + 1) = 0x40000000;
  if ((((this->scales).dims != 1) || ((this->scales).w != 3)) ||
     (((this->scales).elemsize != 4 ||
      (((this->scales).elempack != 1 || ((this->scales).allocator != (Allocator *)0x0)))))) {
    piVar2 = (this->scales).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pAVar3 = (this->scales).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pMVar1->data != (void *)0x0) {
            free(pMVar1->data);
          }
        }
        else {
          (**(code **)(*(long *)pAVar3 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&(this->scales).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->scales).elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (this->scales).refcount = (int *)0x0;
    (this->scales).cstep = 0;
    (this->scales).dims = 0;
    (this->scales).w = 0;
    (this->scales).h = 0;
    (this->scales).c = 0;
    (this->scales).elemsize = 4;
    (this->scales).elempack = 1;
    (this->scales).allocator = (Allocator *)0x0;
    (this->scales).dims = 1;
    (this->scales).w = 3;
    (this->scales).h = 1;
    (this->scales).c = 1;
    (this->scales).cstep = 3;
    local_28 = (void *)0x0;
    iVar5 = posix_memalign(&local_28,0x10,0x10);
    if (iVar5 != 0) {
      local_28 = (void *)0x0;
    }
    (this->scales).data = local_28;
    (this->scales).refcount = (int *)((long)local_28 + 0xc);
    *(undefined4 *)((long)local_28 + 0xc) = 1;
  }
  puVar4 = (undefined8 *)pMVar1->data;
  *puVar4 = 0x4180000041000000;
  *(undefined4 *)(puVar4 + 1) = 0x42000000;
  return;
}

Assistant:

Proposal::Proposal()
{
    one_blob_only = false;
    support_inplace = false;

    // TODO load from param
    ratios.create(3);
    ratios[0] = 0.5f;
    ratios[1] = 1.f;
    ratios[2] = 2.f;

    scales.create(3);
    scales[0] = 8.f;
    scales[1] = 16.f;
    scales[2] = 32.f;
}